

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

bool AM_isTriggerSpecial(int special,int *param_2)

{
  bool bVar1;
  FLineSpecial *pFVar2;
  
  pFVar2 = P_GetLineSpecialInfo(special);
  if ((pFVar2 == (FLineSpecial *)0x0) || (pFVar2->max_args < '\0')) {
    bVar1 = false;
  }
  else if ((((0xe < (uint)special) || (bVar1 = false, (0x5c00U >> (special & 0x1fU) & 1) == 0)) &&
           (bVar1 = false, special != 0xca)) && (bVar1 = false, special != 0xf9)) {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool AM_isTriggerSpecial (int special, int *)
{
	FLineSpecial *spec = P_GetLineSpecialInfo(special);
	return spec != NULL
		&& spec->max_args >= 0
		&& special != Door_Open
		&& special != Door_Close
		&& special != Door_CloseWaitOpen
		&& special != Door_Raise
		&& special != Door_Animated
		&& special != Generic_Door;
}